

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O2

int __thiscall
jrtplib::RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
GotoElement(RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317> *this,
           in6_addr *e)

{
  HashElement *pHVar1;
  bool bVar2;
  int iVar3;
  HashElement **ppHVar4;
  
  iVar3 = RTPUDPv6Trans_GetHashIndex_in6_addr::GetIndex(e);
  if (iVar3 < 0x207d) {
    ppHVar4 = this->table + iVar3;
    iVar3 = -5;
    while( true ) {
      pHVar1 = *ppHVar4;
      this->curhashelem = pHVar1;
      if (pHVar1 == (HashElement *)0x0) break;
      bVar2 = operator==(&pHVar1->element,e);
      if (bVar2) {
        return 0;
      }
      ppHVar4 = &this->curhashelem->hashnext;
    }
  }
  else {
    iVar3 = -6;
  }
  return iVar3;
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::GotoElement(const Element &e)
{
	int index;
	bool found;
	
	index = GetIndex::GetIndex(e);
	if (index >= hashsize)
		return ERR_RTP_HASHTABLE_FUNCTIONRETURNEDINVALIDHASHINDEX;
	
	curhashelem = table[index]; 
	found = false;
	while(!found && curhashelem != 0)
	{
		if (curhashelem->GetElement() == e)
			found = true;
		else
			curhashelem = curhashelem->hashnext;
	}
	if (!found)
		return ERR_RTP_HASHTABLE_ELEMENTNOTFOUND;
	return 0;
}